

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void os_set_text_color(os_color_t fg,os_color_t bg)

{
  osgen_txtwin_t *win;
  char buf [4];
  
  win = S_default_win;
  if (S_default_win != (osgen_txtwin_t *)0x0 && os_f_plain == 0) {
    buf[0] = '\x02';
    buf[1] = osgen_xlat_color_t(fg);
    buf[2] = osgen_xlat_color_t(bg);
    ossaddsb(win,buf,3,1);
  }
  return;
}

Assistant:

void os_set_text_color(os_color_t fg, os_color_t bg)
{
    char buf[4];

    /* if we're in plain mode, ignore it */
    if (os_f_plain || S_default_win == 0)
        return;

    /* add the color sequence to the default window's scrollback buffer */
    buf[0] = OSGEN_COLOR;
    buf[1] = osgen_xlat_color_t(fg);
    buf[2] = osgen_xlat_color_t(bg);
    ossaddsb(S_default_win, buf, 3, TRUE);
}